

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtTriangleMeshShape.cpp
# Opt level: O2

void __thiscall
SupportVertexCallback::SupportVertexCallback
          (SupportVertexCallback *this,cbtVector3 *supportVecWorld,cbtTransform *trans)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  undefined8 uVar3;
  undefined1 auVar5 [56];
  undefined1 auVar4 [64];
  undefined8 in_XMM1_Qb;
  cbtVector3 cVar6;
  
  (this->super_cbtTriangleCallback)._vptr_cbtTriangleCallback =
       (_func_int **)&PTR__cbtTriangleCallback_01195520;
  (this->m_supportVertexLocal).m_floats[0] = 0.0;
  (this->m_supportVertexLocal).m_floats[1] = 0.0;
  (this->m_supportVertexLocal).m_floats[2] = 0.0;
  (this->m_supportVertexLocal).m_floats[3] = 0.0;
  uVar3 = *(undefined8 *)((trans->m_basis).m_el[0].m_floats + 2);
  *(undefined8 *)(this->m_worldTrans).m_basis.m_el[0].m_floats =
       *(undefined8 *)(trans->m_basis).m_el[0].m_floats;
  *(undefined8 *)((this->m_worldTrans).m_basis.m_el[0].m_floats + 2) = uVar3;
  uVar3 = *(undefined8 *)((trans->m_basis).m_el[1].m_floats + 2);
  *(undefined8 *)(this->m_worldTrans).m_basis.m_el[1].m_floats =
       *(undefined8 *)(trans->m_basis).m_el[1].m_floats;
  *(undefined8 *)((this->m_worldTrans).m_basis.m_el[1].m_floats + 2) = uVar3;
  uVar3 = *(undefined8 *)((trans->m_basis).m_el[2].m_floats + 2);
  *(undefined8 *)(this->m_worldTrans).m_basis.m_el[2].m_floats =
       *(undefined8 *)(trans->m_basis).m_el[2].m_floats;
  *(undefined8 *)((this->m_worldTrans).m_basis.m_el[2].m_floats + 2) = uVar3;
  uVar2 = *(ulong *)((trans->m_origin).m_floats + 2);
  auVar5 = ZEXT856(uVar2);
  *(undefined8 *)(this->m_worldTrans).m_origin.m_floats = *(undefined8 *)(trans->m_origin).m_floats;
  *(ulong *)((this->m_worldTrans).m_origin.m_floats + 2) = uVar2;
  this->m_maxDot = -1e+18;
  cVar6 = ::operator*(supportVecWorld,&(this->m_worldTrans).m_basis);
  auVar4._0_8_ = cVar6.m_floats._0_8_;
  auVar4._8_56_ = auVar5;
  auVar1._8_8_ = in_XMM1_Qb;
  auVar1._0_8_ = cVar6.m_floats._8_8_;
  auVar1 = vmovlhps_avx(auVar4._0_16_,auVar1);
  *(undefined1 (*) [16])(this->m_supportVecLocal).m_floats = auVar1;
  return;
}

Assistant:

SupportVertexCallback(const cbtVector3& supportVecWorld, const cbtTransform& trans)
		: m_supportVertexLocal(cbtScalar(0.), cbtScalar(0.), cbtScalar(0.)), m_worldTrans(trans), m_maxDot(cbtScalar(-BT_LARGE_FLOAT))

	{
		m_supportVecLocal = supportVecWorld * m_worldTrans.getBasis();
	}